

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign_x86_fma::forward
          (ROIAlign_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pMVar4;
  Mat *this_00;
  _func_int **pp_Var5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  _func_int *p_Var10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [12];
  undefined1 in_ZMM5 [64];
  undefined1 auVar38 [64];
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 in_register_000015c4 [12];
  allocator_type local_111;
  void *local_110;
  void *local_108;
  long local_100;
  void *local_f8;
  _func_int **local_f0;
  void *local_e8;
  long local_e0;
  ulong local_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ROIAlign_x86_fma *local_90;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  auVar37 = in_ZMM5._4_12_;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar16 = pMVar4->w;
  iVar12 = pMVar4->h;
  local_e8 = (void *)(ulong)(uint)pMVar4->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),pMVar4->c,
              pMVar4->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var5 = this->_vptr_ROIAlign_x86_fma;
    p_Var10 = pp_Var5[-3];
    fVar28 = *(float *)(&this->field_0xd8 + (long)p_Var10);
    uVar2 = *pMVar4[1].data;
    uVar3 = *(undefined8 *)((long)pMVar4[1].data + 8);
    local_b8._0_4_ = fVar28 * (float)uVar2;
    local_b8._4_4_ = fVar28 * (float)((ulong)uVar2 >> 0x20);
    local_b8._8_4_ = fVar28 * 0.0;
    local_b8._12_4_ = fVar28 * 0.0;
    auVar26._0_4_ = (float)uVar3 * fVar28;
    auVar26._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar28;
    auVar26._8_4_ = fVar28 * 0.0;
    auVar26._12_4_ = fVar28 * 0.0;
    bVar24 = (&this->field_0xe0)[(long)p_Var10] != '\0';
    if (bVar24) {
      local_b8._0_4_ = (float)local_b8._0_4_ + -0.5;
      local_b8._4_4_ = local_b8._4_4_ + -0.5;
      local_b8._8_4_ = local_b8._8_4_ + -0.5;
      local_b8._12_4_ = local_b8._12_4_ + -0.5;
      auVar26._0_4_ = auVar26._0_4_ + -0.5;
      auVar26._4_4_ = auVar26._4_4_ + -0.5;
      auVar26._8_4_ = auVar26._8_4_ + -0.5;
      auVar26._12_4_ = auVar26._12_4_ + -0.5;
    }
    auVar26 = vsubps_avx(auVar26,local_b8);
    if (!bVar24) {
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar26 = vmaxps_avx(auVar26,auVar33);
    }
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(&this->field_0xd0 + (long)p_Var10);
    auVar33 = vcvtdq2ps_avx(auVar29);
    auVar29 = vrcpps_avx(auVar33);
    auVar31._0_4_ = auVar26._0_4_ * auVar29._0_4_;
    auVar31._4_4_ = auVar26._4_4_ * auVar29._4_4_;
    auVar31._8_4_ = auVar26._8_4_ * auVar29._8_4_;
    auVar31._12_4_ = auVar26._12_4_ * auVar29._12_4_;
    auVar26 = vfmsub213ps_fma(auVar33,auVar31,auVar26);
    local_c8 = vfnmadd213ps_fma(auVar26,auVar29,auVar31);
    local_90 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var10) == 1) {
      local_108 = (void *)CONCAT44(local_108._4_4_,iVar16);
      iVar16 = *(int *)(&this->field_0xdc + (long)p_Var10);
      fVar25 = (float)iVar16;
      local_a8 = vmovshdup_avx(local_c8);
      fVar28 = fVar25;
      if (iVar16 < 1) {
        auVar26 = vroundss_avx(local_a8,local_a8,10);
        fVar28 = auVar26._0_4_;
      }
      local_f0 = (_func_int **)CONCAT44(local_f0._4_4_,iVar12);
      iVar12 = (int)fVar28;
      if (iVar16 < 1) {
        auVar26 = vroundss_avx(local_c8,local_c8,10);
        fVar25 = auVar26._0_4_;
      }
      iVar16 = (int)fVar25;
      local_100 = (long)iVar12;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * local_100 * iVar16,
                 &local_111);
      auVar26 = vmovshdup_avx(local_b8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_f0,(int)local_108,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),(int)local_100
                 ,iVar16,auVar26._0_4_,local_b8._0_4_,(float)local_a8._0_4_,(float)local_c8._0_4_,
                 (int)local_100,iVar16,&pre_calc);
      if (0 < (int)local_e8) {
        iVar11 = 1;
        if (1 < iVar12 * iVar16) {
          iVar11 = iVar12 * iVar16;
        }
        local_d0 = (_func_int **)pMVar4->data;
        local_d8 = pMVar4->cstep * pMVar4->elemsize;
        local_f8 = this_00->data;
        local_e0 = this_00->cstep * this_00->elemsize;
        local_f0 = this->_vptr_ROIAlign_x86_fma;
        local_110 = (void *)0x0;
        iVar21 = 0;
        if (0 < iVar16) {
          iVar21 = iVar16;
        }
        local_a8._0_4_ = iVar21 * iVar12;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)local_f0[-3])) {
            lVar20 = local_d8 * (long)local_110;
            local_108 = (void *)(local_e0 * (long)local_110 + (long)local_f8);
            iVar19 = 0;
            iVar23 = 0;
            do {
              local_100 = CONCAT44(local_100._4_4_,iVar19);
              iVar17 = *(int *)(&this->field_0xd0 + (long)local_f0[-3]);
              if (0 < iVar17) {
                lVar14 = 0;
                do {
                  if (iVar12 < 1) {
                    fVar28 = 0.0;
                  }
                  else {
                    fVar28 = 0.0;
                    iVar18 = 0;
                    iVar17 = iVar23;
                    do {
                      if (0 < iVar16) {
                        pfVar15 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar17].w1;
                        iVar22 = iVar16;
                        do {
                          auVar26 = vinsertps_avx(ZEXT416(*(uint *)((long)local_d0 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar15 + -4))->pos1 * 4 +
                                                                   lVar20)),
                                                  ZEXT416(*(uint *)((long)local_d0 +
                                                                   (long)(int)pfVar15[-3] * 4 +
                                                                   lVar20)),0x10);
                          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)((long)local_d0 +
                                                                           (long)(int)pfVar15[-2] *
                                                                           4 + lVar20)),0x20);
                          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)((long)local_d0 +
                                                                           (long)(int)pfVar15[-1] *
                                                                           4 + lVar20)),0x30);
                          auVar34._0_4_ = auVar26._0_4_ * *pfVar15;
                          auVar34._4_4_ = auVar26._4_4_ * pfVar15[1];
                          auVar34._8_4_ = auVar26._8_4_ * pfVar15[2];
                          auVar34._12_4_ = auVar26._12_4_ * pfVar15[3];
                          auVar26 = vhaddps_avx(auVar34,auVar34);
                          auVar26 = vhaddps_avx(auVar26,auVar26);
                          fVar28 = fVar28 + auVar26._0_4_;
                          pfVar15 = pfVar15 + 8;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      iVar18 = iVar18 + 1;
                      iVar17 = iVar17 + iVar21;
                    } while (iVar18 != iVar12);
                    iVar23 = iVar23 + iVar21 * iVar12;
                    this = local_90;
                  }
                  *(float *)((long)local_108 + lVar14 * 4) = fVar28 * (1.0 / (float)iVar11);
                  lVar14 = lVar14 + 1;
                  iVar17 = *(int *)(&this->field_0xd0 + (long)local_f0[-3]);
                } while (lVar14 < iVar17);
              }
              local_108 = (void *)((long)local_108 + (long)iVar17 * 4);
              iVar19 = iVar19 + 1;
            } while (iVar19 < *(int *)(&this->field_0xd4 + (long)local_f0[-3]));
          }
          local_110 = (void *)((long)local_110 + 1);
        } while (local_110 != local_e8);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var10) != 0) {
        return 0;
      }
      auVar29 = vroundps_avx(local_c8,10);
      auVar32._8_8_ = 0x4330000000000000;
      auVar32._0_8_ = 0x4330000000000000;
      auVar26 = vorpd_avx(ZEXT416(*(uint *)(&this->field_0xdc + (long)p_Var10)),auVar32);
      auVar26 = vsubpd_avx(auVar26,auVar32);
      auVar26 = vcvtpd2ps_avx(auVar26);
      auVar26 = vmovsldup_avx(auVar26);
      auVar33 = vpshufd_avx(ZEXT116(0 < *(int *)(&this->field_0xdc + (long)p_Var10)),0x50);
      auVar33 = vpslld_avx(auVar33,0x1f);
      auVar26 = vblendvps_avx(auVar29,auVar26,auVar33);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) * (long)(int)auVar26._4_4_ *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * (long)(int)auVar26._0_4_,
                 &local_111);
      p_Var10 = this->_vptr_ROIAlign_x86_fma[-3];
      auVar26 = vmovshdup_avx(local_c8);
      auVar33 = vmovshdup_avx(local_b8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar12,iVar16,*(int *)(&this->field_0xd4 + (long)p_Var10),
                 *(int *)(&this->field_0xd0 + (long)p_Var10),auVar33._0_4_,(float)local_b8._0_4_,
                 auVar26._0_4_,local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var10),&pre_calc)
      ;
      if (0 < (int)local_e8) {
        local_e0 = pMVar4->cstep * pMVar4->elemsize;
        sVar6 = this_00->cstep;
        sVar7 = this_00->elemsize;
        auVar27._0_4_ = (float)iVar12;
        auVar27._4_12_ = auVar37;
        pvVar8 = pMVar4->data;
        auVar30._0_4_ = (float)iVar16;
        auVar30._4_12_ = auVar37;
        pvVar9 = this_00->data;
        local_d0 = this->_vptr_ROIAlign_x86_fma;
        local_f8 = (void *)0x0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)local_d0[-3])) {
            lVar20 = local_e0 * (long)local_f8;
            local_110 = (void *)(sVar6 * sVar7 * (long)local_f8 + (long)pvVar9);
            uVar13 = 0;
            iVar16 = 0;
            do {
              p_Var10 = local_d0[-3];
              iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var10);
              iVar11 = (int)uVar13;
              if (0 < iVar12) {
                auVar35._0_4_ = (float)iVar11;
                auVar35._4_12_ = in_register_000015c4;
                auVar29 = vfmadd213ss_fma(auVar35,auVar26,auVar33);
                auVar36._0_4_ = (float)(iVar11 + 1);
                auVar36._4_12_ = in_register_000015c4;
                auVar34 = vfmadd213ss_fma(auVar36,auVar26,auVar33);
                auVar29 = vmaxss_avx(auVar29,ZEXT816(0) << 0x40);
                auVar31 = vminss_avx(auVar27,auVar29);
                auVar29 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
                auVar29 = vminss_avx(auVar27,auVar29);
                fVar28 = auVar31._0_4_;
                fVar25 = auVar29._0_4_;
                auVar29 = vroundss_avx(ZEXT416((uint)(fVar25 - fVar28)),
                                       ZEXT416((uint)(fVar25 - fVar28)),10);
                lVar14 = 0;
                do {
                  iVar12 = *(int *)(&this->field_0xdc + (long)p_Var10);
                  fVar39 = (float)iVar12;
                  lVar1 = lVar14 + 1;
                  fVar41 = fVar39;
                  if (iVar12 < 1) {
                    fVar41 = auVar29._0_4_;
                  }
                  auVar43._0_4_ = (float)(int)lVar14;
                  auVar43._4_12_ = in_register_000015c4;
                  auVar45._0_4_ = (float)(int)lVar1;
                  auVar45._4_12_ = in_register_000015c4;
                  auVar31 = vfmadd213ss_fma(auVar43,local_c8,local_b8);
                  auVar32 = vfmadd213ss_fma(auVar45,local_c8,local_b8);
                  auVar35 = ZEXT816(0) << 0x40;
                  auVar38 = ZEXT1664(auVar35);
                  auVar31 = vmaxss_avx(auVar31,auVar35);
                  auVar34 = vminss_avx(auVar31,auVar30);
                  auVar31 = vmaxss_avx(auVar32,auVar35);
                  auVar31 = vminss_avx(auVar31,auVar30);
                  fVar42 = auVar34._0_4_;
                  fVar44 = auVar31._0_4_;
                  if (iVar12 < 1) {
                    auVar31 = vroundss_avx(ZEXT416((uint)(fVar44 - fVar42)),
                                           ZEXT416((uint)(fVar44 - fVar42)),10);
                    fVar39 = auVar31._0_4_;
                  }
                  iVar12 = (int)fVar41;
                  iVar21 = (int)fVar39;
                  if (0 < iVar12) {
                    local_100 = CONCAT71(local_100._1_7_,fVar44 <= fVar42);
                    local_f0 = (_func_int **)CONCAT71(local_f0._1_7_,fVar25 <= fVar28);
                    local_a8._0_8_ = lVar1;
                    iVar23 = 0;
                    iVar19 = 0;
                    if (0 < iVar21) {
                      iVar19 = iVar21;
                    }
                    local_108 = (void *)CONCAT44(local_108._4_4_,iVar16);
                    iVar17 = iVar16;
                    do {
                      if (0 < iVar21) {
                        pfVar15 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar17].w1;
                        iVar18 = iVar21;
                        do {
                          auVar31 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar8 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar15 + -4))->pos1 * 4 +
                                                                   lVar20)),
                                                  ZEXT416(*(uint *)((long)pvVar8 +
                                                                   (long)(int)pfVar15[-3] * 4 +
                                                                   lVar20)),0x10);
                          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)((long)pvVar8 +
                                                                           (long)(int)pfVar15[-2] *
                                                                           4 + lVar20)),0x20);
                          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)((long)pvVar8 +
                                                                           (long)(int)pfVar15[-1] *
                                                                           4 + lVar20)),0x30);
                          auVar40._0_4_ = auVar31._0_4_ * *pfVar15;
                          auVar40._4_4_ = auVar31._4_4_ * pfVar15[1];
                          auVar40._8_4_ = auVar31._8_4_ * pfVar15[2];
                          auVar40._12_4_ = auVar31._12_4_ * pfVar15[3];
                          auVar31 = vhaddps_avx(auVar40,auVar40);
                          auVar31 = vhaddps_avx(auVar31,auVar31);
                          auVar38 = ZEXT464((uint)(auVar38._0_4_ + auVar31._0_4_));
                          pfVar15 = pfVar15 + 8;
                          iVar18 = iVar18 + -1;
                        } while (iVar18 != 0);
                      }
                      auVar35 = auVar38._0_16_;
                      iVar23 = iVar23 + 1;
                      iVar17 = iVar17 + iVar19;
                    } while (iVar23 != iVar12);
                    iVar16 = iVar16 + iVar19 * iVar12;
                    this = local_90;
                  }
                  fVar39 = 0.0;
                  if (fVar25 > fVar28 && fVar44 > fVar42) {
                    fVar39 = auVar35._0_4_ / (float)(iVar12 * iVar21);
                  }
                  *(float *)((long)local_110 + lVar14 * 4) = fVar39;
                  p_Var10 = local_d0[-3];
                  iVar12 = *(int *)(&this->field_0xd0 + (long)p_Var10);
                  lVar14 = lVar1;
                  local_d8 = uVar13;
                } while (lVar1 < iVar12);
              }
              local_110 = (void *)((long)local_110 + (long)iVar12 * 4);
              uVar13 = (ulong)(iVar11 + 1U);
            } while ((int)(iVar11 + 1U) < *(int *)(&this->field_0xd4 + (long)local_d0[-3]));
          }
          local_f8 = (void *)((long)local_f8 + 1);
        } while (local_f8 != local_e8);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int ROIAlign_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}